

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O0

void __thiscall
QParallelAnimationGroupPrivate::disconnectUncontrolledAnimations
          (QParallelAnimationGroupPrivate *this)

{
  long lVar1;
  bool bVar2;
  QAnimationGroupPrivate *in_RDI;
  long in_FS_OFFSET;
  piter pVar3;
  AnimationTimeHashConstIt cend;
  AnimationTimeHashConstIt it;
  QAnimationGroupPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QHash<QAbstractAnimation_*,_int>::constBegin
            ((QHash<QAbstractAnimation_*,_int> *)&DAT_aaaaaaaaaaaaaaaa);
  pVar3 = (piter)QHash<QAbstractAnimation_*,_int>::constEnd
                           ((QHash<QAbstractAnimation_*,_int> *)&DAT_aaaaaaaaaaaaaaaa);
  while( true ) {
    bVar2 = QHash<QAbstractAnimation_*,_int>::const_iterator::operator!=
                      ((const_iterator *)pVar3.d,(const_iterator *)this_00);
    if (!bVar2) break;
    QHash<QAbstractAnimation_*,_int>::const_iterator::key((const_iterator *)0x67d4f3);
    QAnimationGroupPrivate::disconnectUncontrolledAnimation(this_00,(QAbstractAnimation *)in_RDI);
    QHash<QAbstractAnimation_*,_int>::const_iterator::operator++((const_iterator *)pVar3.bucket);
  }
  QHash<QAbstractAnimation_*,_int>::clear((QHash<QAbstractAnimation_*,_int> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QParallelAnimationGroupPrivate::disconnectUncontrolledAnimations()
{
    for (AnimationTimeHashConstIt it = uncontrolledFinishTime.constBegin(), cend = uncontrolledFinishTime.constEnd(); it != cend; ++it)
        disconnectUncontrolledAnimation(it.key());

    uncontrolledFinishTime.clear();
}